

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool __thiscall
sf::Shader::loadFromStream
          (Shader *this,InputStream *vertexShaderStream,InputStream *geometryShaderStream,
          InputStream *fragmentShaderStream)

{
  undefined1 *this_00;
  bool bVar1;
  ostream *poVar2;
  reference vertexShaderCode;
  reference geometryShaderCode;
  reference fragmentShaderCode;
  undefined1 local_88 [8];
  vector<char,_std::allocator<char>_> fragmentShader;
  vector<char,_std::allocator<char>_> geometryShader;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> vertexShader;
  InputStream *fragmentShaderStream_local;
  InputStream *geometryShaderStream_local;
  InputStream *vertexShaderStream_local;
  Shader *this_local;
  
  vertexShader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = fragmentShaderStream
  ;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_48);
  bVar1 = anon_unknown.dwarf_ca316::getStreamContents
                    (vertexShaderStream,(vector<char,_std::allocator<char>_> *)local_48);
  if (bVar1) {
    this_00 = &fragmentShader.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
    std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)this_00)
    ;
    bVar1 = anon_unknown.dwarf_ca316::getStreamContents
                      (geometryShaderStream,(vector<char,_std::allocator<char>_> *)this_00);
    if (bVar1) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_88);
      bVar1 = anon_unknown.dwarf_ca316::getStreamContents
                        ((InputStream *)
                         vertexShader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_
                         ,(vector<char,_std::allocator<char>_> *)local_88);
      if (bVar1) {
        vertexShaderCode =
             std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_48,0);
        geometryShaderCode =
             std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)
                        &fragmentShader.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x10,0);
        fragmentShaderCode =
             std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_88,0);
        this_local._7_1_ = compile(this,vertexShaderCode,geometryShaderCode,fragmentShaderCode);
      }
      else {
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Failed to read fragment shader from stream");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_88);
    }
    else {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to read geometry shader from stream");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               &fragmentShader.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to read vertex shader from stream");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_48)
  ;
  return this_local._7_1_;
}

Assistant:

bool Shader::loadFromStream(InputStream& vertexShaderStream, InputStream& geometryShaderStream, InputStream& fragmentShaderStream)
{
    // Read the vertex shader code from the stream
    std::vector<char> vertexShader;
    if (!getStreamContents(vertexShaderStream, vertexShader))
    {
        err() << "Failed to read vertex shader from stream" << std::endl;
        return false;
    }

    // Read the geometry shader code from the stream
    std::vector<char> geometryShader;
    if (!getStreamContents(geometryShaderStream, geometryShader))
    {
        err() << "Failed to read geometry shader from stream" << std::endl;
        return false;
    }

    // Read the fragment shader code from the stream
    std::vector<char> fragmentShader;
    if (!getStreamContents(fragmentShaderStream, fragmentShader))
    {
        err() << "Failed to read fragment shader from stream" << std::endl;
        return false;
    }

    // Compile the shader program
    return compile(&vertexShader[0], &geometryShader[0], &fragmentShader[0]);
}